

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

void __thiscall
QCoreApplication::processEvents
          (QCoreApplication *this,ProcessEventsFlags flags,QDeadlineTimer deadline)

{
  __pointer_type pQVar1;
  bool bVar2;
  int iVar3;
  QThreadData *pQVar4;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QDeadlineTimer local_30;
  long local_20;
  
  local_30.t1 = CONCAT44(in_register_00000034,
                         flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                         super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i);
  local_30._8_8_ = deadline.t1;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QThreadData::currentThreadData();
  if (pQVar4 == (QThreadData *)0x0) {
    pQVar4 = QThreadData::createCurrentThreadData();
  }
  if ((pQVar4->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value._M_b.
      _M_p != (__pointer_type)0x0) {
    do {
      pQVar1 = (pQVar4->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>.
               _q_value._M_b._M_p;
      iVar3 = (*(pQVar1->super_QObject)._vptr_QObject[0xc])(pQVar1,(ulong)((uint)this & 0xfffffffb))
      ;
      if ((char)iVar3 == '\0') break;
      bVar2 = QDeadlineTimer::hasExpired(&local_30);
    } while (!bVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCoreApplication::processEvents(QEventLoop::ProcessEventsFlags flags, QDeadlineTimer deadline)
{
    // ### TODO: consider splitting this method into a public and a private
    //           one, so that a user-invoked processEvents can be detected
    //           and handled properly.
    QThreadData *data = QThreadData::current();
    if (!data->hasEventDispatcher())
        return;

    while (data->eventDispatcher.loadRelaxed()->processEvents(flags & ~QEventLoop::WaitForMoreEvents)) {
        if (deadline.hasExpired())
            break;
    }
}